

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFboCompletenessTests.hpp
# Opt level: O0

void __thiscall
deqp::gls::fboc::details::ParamTest<deqp::gls::fboc::details::RenderableParams>::ParamTest
          (ParamTest<deqp::gls::fboc::details::RenderableParams> *this,Context *ctx,Params *params)

{
  GLenum GVar1;
  RenderableParams *params_00;
  string local_60;
  string local_40;
  RenderableParams *local_20;
  Params *params_local;
  Context *ctx_local;
  ParamTest<deqp::gls::fboc::details::RenderableParams> *this_local;
  
  local_20 = params;
  params_local = (Params *)ctx;
  ctx_local = (Context *)this;
  RenderableParams::getName_abi_cxx11_(&local_40,params,params);
  RenderableParams::getDescription_abi_cxx11_(&local_60,local_20,params_00);
  TestBase::TestBase(&this->super_TestBase,ctx,&local_40,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  (this->super_TestBase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ParamTest_032d5060;
  GVar1 = local_20->bufType;
  (this->m_params).attPoint = local_20->attPoint;
  (this->m_params).bufType = GVar1;
  (this->m_params).format = local_20->format;
  return;
}

Assistant:

ParamTest		(Context& ctx, const Params& params)
					: TestBase	(ctx, Params::getName(params), Params::getDescription(params))
					, m_params	(params) {}